

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMapping.cpp
# Opt level: O0

void __thiscall
TransitionModelMapping::TransitionModelMapping(TransitionModelMapping *this,int nrS,int nrJA)

{
  void *pvVar1;
  int in_EDX;
  undefined4 in_ESI;
  TransitionModelDiscrete *in_RDI;
  int a;
  Matrix *T;
  undefined8 in_stack_ffffffffffffffb8;
  TransitionModelDiscrete *__x;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  void *in_stack_ffffffffffffffe8;
  
  TransitionModelDiscrete::TransitionModelDiscrete
            (in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  (in_RDI->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel =
       (_func_int **)&PTR__TransitionModelMapping_00d359a0;
  __x = in_RDI + 1;
  std::
  vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::vector((vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)0xa9d5f9);
  for (iVar2 = 0; iVar2 != in_EDX; iVar2 = iVar2 + 1) {
    pvVar1 = operator_new(0x28);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)CONCAT44(in_ESI,in_EDX),(size_type)in_stack_ffffffffffffffe8,
             CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::clear(in_stack_ffffffffffffffd0);
    std::
    vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back((vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 *)in_stack_ffffffffffffffd0,(value_type *)__x);
    in_stack_ffffffffffffffe8 = pvVar1;
  }
  return;
}

Assistant:

TransitionModelMapping::TransitionModelMapping(int nrS, int nrJA) :
    TransitionModelDiscrete(nrS, nrJA)
{    
    Matrix *T;
    for(int a=0;a!=nrJA;++a)
    {
        T=new Matrix(nrS,nrS);
        T->clear();
        _m_T.push_back(T);
    }
}